

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor
          (GenericSoundEssenceDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  GenericSoundEssenceDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  FileDescriptor::FileDescriptor(&this->super_FileDescriptor,d);
  (this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
  _vptr_KLVPacket = (_func_int **)&PTR__GenericSoundEssenceDescriptor_0033a6b0;
  Rational::Rational(&this->AudioSamplingRate);
  this->Locked = '\0';
  optional_property<unsigned_char>::optional_property(&this->AudioRefLevel);
  optional_property<unsigned_char>::optional_property(&this->ElectroSpatialFormulation);
  this->ChannelCount = 0;
  this->QuantizationBits = 0;
  optional_property<unsigned_char>::optional_property(&this->DialNorm);
  UL::UL(&this->SoundEssenceCoding);
  optional_property<unsigned_char>::optional_property(&this->ReferenceAudioAlignmentLevel);
  optional_property<ASDCP::MXF::Rational>::optional_property(&this->ReferenceImageEditRate);
  if ((this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.m_Dict !=
      (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_FileDescriptor).super_GenericDescriptor.
                           super_InterchangeObject.m_Dict,MDD_GenericSoundEssenceDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                   super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x5c9,
                "ASDCP::MXF::GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor(const Dictionary *)"
               );
}

Assistant:

GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor(const Dictionary* d) : FileDescriptor(d), Locked(0), ChannelCount(0), QuantizationBits(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_GenericSoundEssenceDescriptor);
}